

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O1

int Col_WordType(Col_Word word)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if (word != 0) {
    if ((word & 0xf) == 0) {
      uVar3 = -(uint)((*(byte *)word & 2) == 0) | *(byte *)word & 0xfffffffe;
    }
    else {
      uVar3 = immediateWordTypes[(uint)word & 0x1f];
    }
  }
  if ((int)uVar3 < 0x1e) {
    switch(uVar3) {
    case 2:
      return (int)*(ushort *)(word + 2);
    case 0xe:
    case 0x12:
      return 0x40;
    case 0x16:
      return 0x280;
    case 0x1a:
      return 0x380;
    case 0xfffffff9:
      return (word < 0x20 | 4) << 7;
    case 0xfffffffa:
      return 0x200;
    case 0xfffffffb:
    case 6:
    case 10:
      return 0x60;
    case 0xfffffffc:
      iVar1 = 0x70;
      if ((word & 0xe0) == 0) {
        iVar1 = 2;
      }
      return iVar1;
    case 0xfffffffd:
      return 8;
    case 0xfffffffe:
      return 4;
    case 0xffffffff:
      uVar2 = *(uint *)(*(ulong *)word & 0xfffffffffffffffe);
      if (uVar2 == 0x2000) {
        return 0x2801;
      }
      if (uVar2 == 0x4000) {
        return 0x4801;
      }
      uVar2 = uVar2 | 1;
    }
  }
  else if ((int)uVar3 < 0x2e) {
    if ((int)uVar3 < 0x26) {
      if (uVar3 == 0x1e) {
        return 0x200;
      }
      if (uVar3 == 0x22) {
        return 0x200;
      }
    }
    else {
      if (uVar3 == 0x26) {
        return 0x600;
      }
      if (uVar3 == 0x2a) {
        return 0x2800;
      }
    }
  }
  else if ((int)uVar3 < 0x46) {
    if (uVar3 == 0x2e) {
      return 0x3000;
    }
    if (uVar3 == 0x42) {
      return 0x4800;
    }
  }
  else {
    if (uVar3 == 0x46) {
      return 0x5000;
    }
    if (uVar3 == 0x72) {
      return 0x8000;
    }
  }
  return uVar2;
}

Assistant:

int
Col_WordType(
    Col_Word word)  /*!< The word to get type for. */
{
    switch (WORD_TYPE(word)) {
    /*
     * Immediate words.
     */

    case WORD_TYPE_NIL:
        return COL_NIL;

    case WORD_TYPE_SMALLINT:
        return COL_INT;

    case WORD_TYPE_SMALLFP:
        return COL_FLOAT;

    case WORD_TYPE_CHARBOOL:
        return (WORD_CHAR_WIDTH(word) ? COL_CHAR | COL_STRING | COL_ROPE
            : COL_BOOL);

    case WORD_TYPE_SMALLSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_CIRCLIST:
        return COL_LIST;

    case WORD_TYPE_VOIDLIST:
        return (WORD_VOIDLIST_LENGTH(word) == 0 ? COL_VECTOR : 0) | COL_LIST;

    /*
     * Predefined types.
     */

    case WORD_TYPE_WRAP:
        return WORD_WRAP_TYPE(word);

    case WORD_TYPE_UCSSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_UTFSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_SUBROPE:
    case WORD_TYPE_CONCATROPE:
        return COL_ROPE;

    case WORD_TYPE_VECTOR:
        return COL_VECTOR | COL_LIST;

    case WORD_TYPE_MVECTOR:
        return COL_MVECTOR | COL_VECTOR | COL_LIST;

    case WORD_TYPE_SUBLIST:
    case WORD_TYPE_CONCATLIST:
        return COL_LIST;

    case WORD_TYPE_STRHASHMAP:
        return COL_MAP | COL_HASHMAP;

    case WORD_TYPE_INTHASHMAP:
        return COL_INTMAP | COL_HASHMAP;

    case WORD_TYPE_STRTRIEMAP:
        return COL_MAP | COL_TRIEMAP;

    case WORD_TYPE_INTTRIEMAP:
        return COL_INTMAP | COL_TRIEMAP;

    case WORD_TYPE_STRBUF:
        return COL_STRBUF;

    /*
     * Mutable concat list nodes are only used internally, but handle them here
     * anyway for proper type checking in list procs.
     */

    case WORD_TYPE_MCONCATLIST:
        return COL_MLIST | COL_LIST;

    /*
     * Custom word.
     */

    case WORD_TYPE_CUSTOM:
        switch (WORD_TYPEINFO(word)->type) {
        case COL_HASHMAP: return COL_CUSTOM | COL_MAP | COL_HASHMAP;
        case COL_TRIEMAP: return COL_CUSTOM | COL_MAP | COL_TRIEMAP;
        default:          return COL_CUSTOM | WORD_TYPEINFO(word)->type;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
        return 0;
    }
}